

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_escape.hpp
# Opt level: O2

void nlohmann::json_abi_v3_11_2::detail::replace_substring<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)s,(ulong)f);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)s,uVar1,(string *)f->_M_string_length);
  }
  return;
}

Assistant:

inline void replace_substring(StringType& s, const StringType& f,
                              const StringType& t)
{
    JSON_ASSERT(!f.empty());
    for (auto pos = s.find(f);                // find first occurrence of f
            pos != StringType::npos;          // make sure f was found
            s.replace(pos, f.size(), t),      // replace with t, and
            pos = s.find(f, pos + t.size()))  // find next occurrence of f
    {}
}